

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

void Nwk_ManDfs_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  
  iVar1 = pObj->pMan->nTravIds;
  if (pObj->TravId != iVar1) {
    pObj->TravId = iVar1;
    if (0 < pObj->nFanins) {
      lVar4 = 0;
      do {
        if (pObj->pFanio[lVar4] == (Nwk_Obj_t *)0x0) break;
        Nwk_ManDfs_rec(pObj->pFanio[lVar4],vNodes);
        lVar4 = lVar4 + 1;
      } while (lVar4 < pObj->nFanins);
    }
    uVar2 = vNodes->nSize;
    if (uVar2 == vNodes->nCap) {
      if ((int)uVar2 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar3 = vNodes->pArray;
    }
    iVar1 = vNodes->nSize;
    vNodes->nSize = iVar1 + 1;
    ppvVar3[iVar1] = pObj;
  }
  return;
}

Assistant:

void Nwk_ManDfs_rec( Nwk_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        Nwk_ManDfs_rec( pNext, vNodes );
    Vec_PtrPush( vNodes, pObj );
}